

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_vigorize(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *bch;
  bool bVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  CHAR_DATA **ppCVar5;
  
  if (ch->in_room->sector_type == 8) {
    send_to_char("You cannot cast this spell underwater.\n\r",ch);
    return;
  }
  uVar4 = (ulong)(uint)level;
  sVar2 = ch->in_room->area->temp;
  if ((sVar2 == 3) || (sVar2 == 0)) {
    uVar4 = (long)level / 2 & 0xffffffff;
  }
  act("You blanket the area with a soothing mist.",ch,(void *)0x0,(void *)0x0,3);
  act("$n blankets the area with a soothing mist.",ch,(void *)0x0,(void *)0x0,0);
  ppCVar5 = &ch->in_room->people;
  while (bch = *ppCVar5, bch != (CHAR_DATA *)0x0) {
    bVar1 = is_same_group(ch,bch);
    if (!bVar1) {
      bVar1 = is_same_cabal(ch,bch);
      if (!bVar1) {
        uVar4 = (long)(int)uVar4 / 3 & 0xffffffff;
      }
    }
    send_to_char("As the mist settles over you, you feel refreshed!\n\r",bch);
    iVar3 = (int)bch->move + (int)uVar4;
    sVar2 = (short)iVar3;
    if (bch->max_move <= iVar3) {
      sVar2 = bch->max_move;
    }
    bch->move = sVar2;
    ppCVar5 = &bch->next_in_room;
  }
  return;
}

Assistant:

void spell_vigorize(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	int refresh = 0;

	if (ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this spell underwater.\n\r", ch);
		return;
	}

	refresh = level;

	if (ch->in_room->area->temp == Temperature::Hot || ch->in_room->area->temp == Temperature::Cold)
		refresh /= 2;

	act("You blanket the area with a soothing mist.", ch, 0, 0, TO_CHAR);
	act("$n blankets the area with a soothing mist.", ch, 0, 0, TO_ROOM);

	for (vch = ch->in_room->people; vch; vch = vch->next_in_room)
	{
		if (!(is_same_group(ch, vch) || is_same_cabal(ch, vch)))
			refresh /= 3;

		send_to_char("As the mist settles over you, you feel refreshed!\n\r", vch);
		vch->move = std::min(vch->move + refresh, (int)vch->max_move);
	}
}